

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O3

void __thiscall
cmQtAutoGenInitializer::cmQtAutoGenInitializer
          (cmQtAutoGenInitializer *this,cmQtAutoGenGlobalInitializer *globalInitializer,
          cmGeneratorTarget *target,IntegerVersion *qtVersion,bool mocEnabled,bool uicEnabled,
          bool rccEnabled,bool globalAutogenTarget,bool globalAutoRccTarget)

{
  _Rb_tree_header *p_Var1;
  string *psVar2;
  
  this->GlobalInitializer = globalInitializer;
  this->Target = target;
  this->QtVersion = *qtVersion;
  this->MultiConfig = false;
  (this->ConfigDefault)._M_dataplus._M_p = (pointer)&(this->ConfigDefault).field_2;
  (this->ConfigDefault)._M_string_length = 0;
  (this->ConfigDefault).field_2._M_local_buf[0] = '\0';
  (this->ConfigsList).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ConfigsList).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ConfigsList).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Verbosity)._M_dataplus._M_p = (pointer)&(this->Verbosity).field_2;
  (this->Verbosity)._M_string_length = 0;
  (this->Verbosity).field_2._M_local_buf[0] = '\0';
  (this->TargetsFolder)._M_dataplus._M_p = (pointer)&(this->TargetsFolder).field_2;
  (this->TargetsFolder)._M_string_length = 0;
  (this->TargetsFolder).field_2._M_local_buf[0] = '\0';
  this->CMP0071Accept = false;
  this->CMP0071Warn = false;
  (this->Dir).Info._M_dataplus._M_p = (pointer)&(this->Dir).Info.field_2;
  (this->Dir).Info._M_string_length = 0;
  (this->Dir).Info.field_2._M_local_buf[0] = '\0';
  (this->Dir).Build._M_dataplus._M_p = (pointer)&(this->Dir).Build.field_2;
  (this->Dir).Build._M_string_length = 0;
  (this->Dir).Build.field_2._M_local_buf[0] = '\0';
  (this->Dir).Work._M_dataplus._M_p = (pointer)&(this->Dir).Work.field_2;
  (this->Dir).Work._M_string_length = 0;
  (this->Dir).Work.field_2._M_local_buf[0] = '\0';
  (this->Dir).Include._M_dataplus._M_p = (pointer)&(this->Dir).Include.field_2;
  (this->Dir).Include._M_string_length = 0;
  (this->Dir).Include.field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->Dir).ConfigInclude._M_t._M_impl.super__Rb_tree_header;
  (this->Dir).ConfigInclude._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Dir).ConfigInclude._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Dir).ConfigInclude._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->Dir).ConfigInclude._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->Dir).ConfigInclude._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->AutogenTarget).Name._M_dataplus._M_p = (pointer)&(this->AutogenTarget).Name.field_2;
  (this->AutogenTarget).Name._M_string_length = 0;
  (this->AutogenTarget).Name.field_2._M_local_buf[0] = '\0';
  (this->AutogenTarget).GlobalTarget = false;
  (this->AutogenTarget).Parallel._M_dataplus._M_p = (pointer)&(this->AutogenTarget).Parallel.field_2
  ;
  (this->AutogenTarget).Parallel._M_string_length = 0;
  (this->AutogenTarget).Parallel.field_2._M_local_buf[0] = '\0';
  (this->AutogenTarget).InfoFile._M_dataplus._M_p = (pointer)&(this->AutogenTarget).InfoFile.field_2
  ;
  (this->AutogenTarget).InfoFile._M_string_length = 0;
  (this->AutogenTarget).InfoFile.field_2._M_local_buf[0] = '\0';
  (this->AutogenTarget).SettingsFile._M_dataplus._M_p =
       (pointer)&(this->AutogenTarget).SettingsFile.field_2;
  (this->AutogenTarget).SettingsFile._M_string_length = 0;
  (this->AutogenTarget).SettingsFile.field_2._M_local_buf[0] = '\0';
  (this->AutogenTarget).ParseCacheFile._M_dataplus._M_p =
       (pointer)&(this->AutogenTarget).ParseCacheFile.field_2;
  (this->AutogenTarget).ParseCacheFile._M_string_length = 0;
  (this->AutogenTarget).ParseCacheFile.field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->AutogenTarget).ConfigSettingsFile._M_t._M_impl.super__Rb_tree_header;
  (this->AutogenTarget).ConfigSettingsFile._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->AutogenTarget).ConfigSettingsFile._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->AutogenTarget).ConfigSettingsFile._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->AutogenTarget).ConfigSettingsFile._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->AutogenTarget).ConfigSettingsFile._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->AutogenTarget).DependOrigin = false;
  p_Var1 = &(this->AutogenTarget).DependFiles._M_t._M_impl.super__Rb_tree_header;
  (this->AutogenTarget).DependFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->AutogenTarget).DependFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->AutogenTarget).DependFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->AutogenTarget).DependFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->AutogenTarget).DependFiles._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->AutogenTarget).DependTargets._M_t._M_impl.super__Rb_tree_header;
  (this->AutogenTarget).DependTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
  ;
  (this->AutogenTarget).DependTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->AutogenTarget).DependTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->AutogenTarget).DependTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->AutogenTarget).DependTargets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->AutogenTarget).Headers._M_h._M_buckets =
       &(this->AutogenTarget).Headers._M_h._M_single_bucket;
  (this->AutogenTarget).Headers._M_h._M_bucket_count = 1;
  (this->AutogenTarget).Headers._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->AutogenTarget).Headers._M_h._M_element_count = 0;
  (this->AutogenTarget).Headers._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->AutogenTarget).Headers._M_h._M_rehash_policy._M_next_resize = 0;
  (this->AutogenTarget).Headers._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->AutogenTarget).Sources._M_h._M_buckets =
       &(this->AutogenTarget).Sources._M_h._M_single_bucket;
  (this->AutogenTarget).Sources._M_h._M_bucket_count = 1;
  (this->AutogenTarget).Sources._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->AutogenTarget).Sources._M_h._M_element_count = 0;
  (this->AutogenTarget).Sources._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->AutogenTarget).FilesGenerated.
  super__Vector_base<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->AutogenTarget).FilesGenerated.
  super__Vector_base<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->AutogenTarget).FilesGenerated.
  super__Vector_base<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->AutogenTarget).Sources._M_h._M_rehash_policy._M_next_resize = 0;
  (this->AutogenTarget).Sources._M_h._M_single_bucket = (__node_base_ptr)0x0;
  MocT::MocT(&this->Moc);
  UicT::UicT(&this->Uic);
  (this->Rcc).super_GenVarsT.Enabled = false;
  (this->Rcc).super_GenVarsT.Gen = RCC;
  psVar2 = cmQtAutoGen::GeneratorNameUpper_abi_cxx11_(RCC);
  (this->Rcc).super_GenVarsT.GenNameUpper = psVar2;
  (this->Rcc).super_GenVarsT.ExecutableTargetName._M_dataplus._M_p =
       (pointer)&(this->Rcc).super_GenVarsT.ExecutableTargetName.field_2;
  (this->Rcc).super_GenVarsT.ExecutableTargetName._M_string_length = 0;
  (this->Rcc).super_GenVarsT.ExecutableTargetName.field_2._M_local_buf[0] = '\0';
  (this->Rcc).super_GenVarsT.ExecutableTarget = (cmGeneratorTarget *)0x0;
  (this->Rcc).super_GenVarsT.Executable._M_dataplus._M_p =
       (pointer)&(this->Rcc).super_GenVarsT.Executable.field_2;
  (this->Rcc).super_GenVarsT.Executable._M_string_length = 0;
  (this->Rcc).super_GenVarsT.Executable.field_2._M_local_buf[0] = '\0';
  (this->Rcc).Qrcs.
  super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Rcc).Qrcs.
  super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Rcc).Qrcs.
  super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Rcc).super_GenVarsT.ExecutableFeatures.
  super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->Rcc).super_GenVarsT.ExecutableFeatures.
  super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->AutogenTarget).GlobalTarget = globalAutogenTarget;
  (this->Moc).super_GenVarsT.Enabled = mocEnabled;
  (this->Uic).super_GenVarsT.Enabled = uicEnabled;
  (this->Rcc).super_GenVarsT.Enabled = rccEnabled;
  (this->Rcc).GlobalTarget = globalAutoRccTarget;
  return;
}

Assistant:

cmQtAutoGenInitializer::cmQtAutoGenInitializer(
  cmQtAutoGenGlobalInitializer* globalInitializer, cmGeneratorTarget* target,
  IntegerVersion const& qtVersion, bool mocEnabled, bool uicEnabled,
  bool rccEnabled, bool globalAutogenTarget, bool globalAutoRccTarget)
  : GlobalInitializer(globalInitializer)
  , Target(target)
  , QtVersion(qtVersion)
{
  AutogenTarget.GlobalTarget = globalAutogenTarget;
  Moc.Enabled = mocEnabled;
  Uic.Enabled = uicEnabled;
  Rcc.Enabled = rccEnabled;
  Rcc.GlobalTarget = globalAutoRccTarget;
}